

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O1

void __thiscall
ncnn::MultiHeadAttention_x86_avx512::MultiHeadAttention_x86_avx512
          (MultiHeadAttention_x86_avx512 *this)

{
  MultiHeadAttention::MultiHeadAttention(&this->super_MultiHeadAttention);
  (this->super_MultiHeadAttention).super_Layer._vptr_Layer =
       (_func_int **)&PTR__MultiHeadAttention_00667468;
  (this->super_MultiHeadAttention).super_Layer.support_packing = true;
  this->q_gemm = (Layer *)0x0;
  this->k_gemm = (Layer *)0x0;
  this->v_gemm = (Layer *)0x0;
  this->o_gemm = (Layer *)0x0;
  this->o_gemm = (Layer *)0x0;
  this->qk_gemm = (Layer *)0x0;
  this->qkv_gemm = (Layer *)0x0;
  this->qk_softmax = (Layer *)0x0;
  return;
}

Assistant:

MultiHeadAttention_x86_avx512::MultiHeadAttention_x86_avx512()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    q_gemm = 0;
    k_gemm = 0;
    v_gemm = 0;

    qk_gemm = 0;
    qkv_gemm = 0;

    qk_softmax = 0;

    o_gemm = 0;
}